

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEBody.cpp
# Opt level: O0

bool __thiscall test_CEBody::test_GetCoordinates(test_CEBody *this)

{
  byte bVar1;
  long *in_RDI;
  CESkyCoord test_coords;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  CEBody *in_stack_ffffffffffffff28;
  allocator *paVar2;
  CEDateType in_stack_ffffffffffffff34;
  CEDate *this_00;
  undefined4 local_b0;
  allocator local_a9;
  string local_a8 [32];
  CESkyCoord *in_stack_ffffffffffffff78;
  CESkyCoord *in_stack_ffffffffffffff80;
  
  this_00 = (CEDate *)(in_RDI + 0x44);
  CEDate::CurrentJD();
  CEDate::CEDate(this_00,(double)in_RDI,in_stack_ffffffffffffff34);
  CEBody::GetCoordinates
            (in_stack_ffffffffffffff28,
             (CEDate *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  CEDate::~CEDate((CEDate *)0x11e9d0);
  bVar1 = operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  paVar2 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"test_GetCoordinates",paVar2);
  local_b0 = 0x83;
  (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1 & 1,1,local_a8,&local_b0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CESkyCoord::~CESkyCoord((CESkyCoord *)CONCAT17(bVar1,in_stack_ffffffffffffff20));
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEBody::test_GetCoordinates(void)
{
    // Test getting the coordinates
    CESkyCoord test_coords = base_.GetCoordinates();
    
    // Test that the coordinates are equal
    test_bool(test_coords == base_, true, __func__, __LINE__);

    return pass();
}